

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraBmc.c
# Opt level: O0

int Fra_BmcNodesAreEqual(Aig_Obj_t *pObj0,Aig_Obj_t *pObj1)

{
  void *pvVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  int local_4c;
  int i;
  Aig_Obj_t *pObjFraig1;
  Aig_Obj_t *pObjFraig0;
  Aig_Obj_t *pObjFrames1;
  Aig_Obj_t *pObjFrames0;
  Fra_Man_t *p;
  Aig_Obj_t *pObj1_local;
  Aig_Obj_t *pObj0_local;
  
  pvVar1 = (pObj0->field_5).pData;
  local_4c = **(int **)((long)pvVar1 + 0x40);
  do {
    if (*(int *)(*(long *)((long)pvVar1 + 0x40) + 8) <= local_4c) {
      return 1;
    }
    pAVar2 = Bmc_ObjFrames(pObj0,local_4c);
    pAVar2 = Aig_Regular(pAVar2);
    pAVar3 = Bmc_ObjFrames(pObj1,local_4c);
    pAVar3 = Aig_Regular(pAVar3);
    if (pAVar2 != pAVar3) {
      pAVar2 = Bmc_ObjFraig(pAVar2);
      pAVar2 = Aig_Regular(pAVar2);
      pAVar3 = Bmc_ObjFraig(pAVar3);
      pAVar3 = Aig_Regular(pAVar3);
      if (pAVar2 != pAVar3) {
        return 0;
      }
    }
    local_4c = local_4c + 1;
  } while( true );
}

Assistant:

int Fra_BmcNodesAreEqual( Aig_Obj_t * pObj0, Aig_Obj_t * pObj1 )
{
    Fra_Man_t * p = (Fra_Man_t *)pObj0->pData;
    Aig_Obj_t * pObjFrames0, * pObjFrames1;
    Aig_Obj_t * pObjFraig0, * pObjFraig1;
    int i;
    for ( i = p->pBmc->nPref; i < p->pBmc->nFramesAll; i++ )
    {
        pObjFrames0 = Aig_Regular( Bmc_ObjFrames(pObj0, i) );
        pObjFrames1 = Aig_Regular( Bmc_ObjFrames(pObj1, i) );
        if ( pObjFrames0 == pObjFrames1 )
            continue;
        pObjFraig0 = Aig_Regular( Bmc_ObjFraig(pObjFrames0) );
        pObjFraig1 = Aig_Regular( Bmc_ObjFraig(pObjFrames1) );
        if ( pObjFraig0 != pObjFraig1 )
            return 0;
    }
    return 1;
}